

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3UpsertAnalyzeTarget(Parse *pParse,SrcList *pTabList,Upsert *pUpsert)

{
  int iTab;
  Table *pTVar1;
  ExprList *pEVar2;
  Expr *pEVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  Expr *extraout_RAX;
  Expr *pEVar7;
  ExprList *pEVar8;
  ulong uVar9;
  ulong uVar10;
  Index *pIVar11;
  Expr sCol [2];
  NameContext sNC;
  Expr local_f8;
  Expr local_b0;
  NameContext local_68;
  
  local_68.uNC.pEList = (ExprList *)0x0;
  local_68.pNext = (NameContext *)0x0;
  local_68.nRef = 0;
  local_68.nErr = 0;
  local_68.ncFlags = 0;
  local_68._44_4_ = 0;
  local_68.pWinSelect = (Select *)0x0;
  local_68.pParse = pParse;
  local_68.pSrcList = pTabList;
  uVar4 = sqlite3ResolveExprListNames(&local_68,pUpsert->pUpsertTarget);
  pEVar7 = (Expr *)(ulong)uVar4;
  if (uVar4 == 0) {
    uVar4 = sqlite3ResolveExprNames(&local_68,pUpsert->pUpsertTargetWhere);
    pEVar7 = (Expr *)(ulong)uVar4;
    if (uVar4 == 0) {
      pTVar1 = pTabList->a[0].pTab;
      pEVar2 = pUpsert->pUpsertTarget;
      iTab = pTabList->a[0].iCursor;
      if (((((pTVar1->tabFlags & 0x20) != 0) || (pEVar2->nExpr != 1)) ||
          (pEVar7 = pEVar2->a[0].pExpr, pEVar7->op != -0x5e)) ||
         ((short)*(int *)&pEVar7->iColumn != -1)) {
        memset(&local_f8,0,0x90);
        local_f8.op = 'j';
        local_f8.pLeft = &local_b0;
        local_b0.op = 0xa2;
        pIVar11 = pTVar1->pIndex;
        local_b0.iTable = iTab;
        if (pIVar11 != (Index *)0x0) {
          do {
            if (((pIVar11->onError != '\0') && (pEVar2->nExpr == (uint)pIVar11->nKeyCol)) &&
               ((pIVar11->pPartIdxWhere == (Expr *)0x0 ||
                ((pUpsert->pUpsertTargetWhere != (Expr *)0x0 &&
                 (iVar5 = sqlite3ExprCompare(pParse,pUpsert->pUpsertTargetWhere,
                                             pIVar11->pPartIdxWhere,iTab), iVar5 == 0)))))) {
              uVar6 = (ulong)pIVar11->nKeyCol;
              if (uVar6 != 0) {
                uVar10 = 0;
                do {
                  local_f8.u = *(anon_union_8_2_443a03b8_for_u *)(pIVar11->azColl + uVar10);
                  if (pIVar11->aiColumn[uVar10] == -2) {
                    pEVar3 = pIVar11->aColExpr->a[uVar10].pExpr;
                    pEVar7 = pEVar3;
                    if (pEVar3->op != 'j') {
                      pEVar7 = &local_f8;
                      local_f8.pLeft = pEVar3;
                    }
                  }
                  else {
                    local_f8.pLeft = &local_b0;
                    pEVar7 = &local_f8;
                    local_b0.iColumn = pIVar11->aiColumn[uVar10];
                  }
                  uVar4 = sqlite3ExprCompare(pParse,pEVar2->a[0].pExpr,pEVar7,iTab);
                  if (1 < uVar4) {
                    uVar9 = 0;
                    pEVar8 = pEVar2 + 1;
                    do {
                      if (uVar6 - 1 == uVar9) goto LAB_001b9b61;
                      uVar4 = sqlite3ExprCompare(pParse,*(Expr **)pEVar8,pEVar7,iTab);
                      pEVar8 = (ExprList *)&pEVar8->a[0].sortOrder;
                      uVar9 = uVar9 + 1;
                    } while (1 < uVar4);
                    if (uVar6 <= uVar9) goto LAB_001b9b61;
                  }
                  uVar10 = uVar10 + 1;
                  if (uVar10 == uVar6) break;
                } while( true );
              }
              pUpsert->pUpsertIdx = pIVar11;
              pEVar7 = (Expr *)pUpsert;
              goto LAB_001b9c6f;
            }
LAB_001b9b61:
            pIVar11 = pIVar11->pNext;
          } while (pIVar11 != (Index *)0x0);
        }
        sqlite3ErrorMsg(pParse,
                        "ON CONFLICT clause does not match any PRIMARY KEY or UNIQUE constraint");
        pEVar7 = extraout_RAX;
      }
    }
  }
LAB_001b9c6f:
  return (int)pEVar7;
}

Assistant:

SQLITE_PRIVATE int sqlite3UpsertAnalyzeTarget(
  Parse *pParse,     /* The parsing context */
  SrcList *pTabList, /* Table into which we are inserting */
  Upsert *pUpsert    /* The ON CONFLICT clauses */
){
  Table *pTab;            /* That table into which we are inserting */
  int rc;                 /* Result code */
  int iCursor;            /* Cursor used by pTab */
  Index *pIdx;            /* One of the indexes of pTab */
  ExprList *pTarget;      /* The conflict-target clause */
  Expr *pTerm;            /* One term of the conflict-target clause */
  NameContext sNC;        /* Context for resolving symbolic names */
  Expr sCol[2];           /* Index column converted into an Expr */

  assert( pTabList->nSrc==1 );
  assert( pTabList->a[0].pTab!=0 );
  assert( pUpsert!=0 );
  assert( pUpsert->pUpsertTarget!=0 );

  /* Resolve all symbolic names in the conflict-target clause, which
  ** includes both the list of columns and the optional partial-index
  ** WHERE clause.
  */
  memset(&sNC, 0, sizeof(sNC));
  sNC.pParse = pParse;
  sNC.pSrcList = pTabList;
  rc = sqlite3ResolveExprListNames(&sNC, pUpsert->pUpsertTarget);
  if( rc ) return rc;
  rc = sqlite3ResolveExprNames(&sNC, pUpsert->pUpsertTargetWhere);
  if( rc ) return rc;

  /* Check to see if the conflict target matches the rowid. */  
  pTab = pTabList->a[0].pTab;
  pTarget = pUpsert->pUpsertTarget;
  iCursor = pTabList->a[0].iCursor;
  if( HasRowid(pTab) 
   && pTarget->nExpr==1
   && (pTerm = pTarget->a[0].pExpr)->op==TK_COLUMN
   && pTerm->iColumn==XN_ROWID
  ){
    /* The conflict-target is the rowid of the primary table */
    assert( pUpsert->pUpsertIdx==0 );
    return SQLITE_OK;
  }

  /* Initialize sCol[0..1] to be an expression parse tree for a
  ** single column of an index.  The sCol[0] node will be the TK_COLLATE
  ** operator and sCol[1] will be the TK_COLUMN operator.  Code below
  ** will populate the specific collation and column number values
  ** prior to comparing against the conflict-target expression.
  */
  memset(sCol, 0, sizeof(sCol));
  sCol[0].op = TK_COLLATE;
  sCol[0].pLeft = &sCol[1];
  sCol[1].op = TK_COLUMN;
  sCol[1].iTable = pTabList->a[0].iCursor;

  /* Check for matches against other indexes */
  for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
    int ii, jj, nn;
    if( !IsUniqueIndex(pIdx) ) continue;
    if( pTarget->nExpr!=pIdx->nKeyCol ) continue;
    if( pIdx->pPartIdxWhere ){
      if( pUpsert->pUpsertTargetWhere==0 ) continue;
      if( sqlite3ExprCompare(pParse, pUpsert->pUpsertTargetWhere,
                             pIdx->pPartIdxWhere, iCursor)!=0 ){
        continue;
      }
    }
    nn = pIdx->nKeyCol;
    for(ii=0; ii<nn; ii++){
      Expr *pExpr;
      sCol[0].u.zToken = (char*)pIdx->azColl[ii];
      if( pIdx->aiColumn[ii]==XN_EXPR ){
        assert( pIdx->aColExpr!=0 );
        assert( pIdx->aColExpr->nExpr>ii );
        pExpr = pIdx->aColExpr->a[ii].pExpr;
        if( pExpr->op!=TK_COLLATE ){
          sCol[0].pLeft = pExpr;
          pExpr = &sCol[0];
        }
      }else{
        sCol[0].pLeft = &sCol[1];
        sCol[1].iColumn = pIdx->aiColumn[ii];
        pExpr = &sCol[0];
      }
      for(jj=0; jj<nn; jj++){
        if( sqlite3ExprCompare(pParse, pTarget->a[jj].pExpr, pExpr,iCursor)<2 ){
          break;  /* Column ii of the index matches column jj of target */
        }
      }
      if( jj>=nn ){
        /* The target contains no match for column jj of the index */
        break;
      }
    }
    if( ii<nn ){
      /* Column ii of the index did not match any term of the conflict target.
      ** Continue the search with the next index. */
      continue;
    }
    pUpsert->pUpsertIdx = pIdx;
    return SQLITE_OK;
  }
  sqlite3ErrorMsg(pParse, "ON CONFLICT clause does not match any "
                          "PRIMARY KEY or UNIQUE constraint");
  return SQLITE_ERROR;
}